

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O0

Vec_Int_t * Dau_DecFindSets(word *pInit,int nVars)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  int *local_a8;
  int *pSched [16];
  int v;
  Vec_Int_t *vSets;
  int nVars_local;
  word *pInit_local;
  
  memset(&local_a8,0,0x80);
  for (pSched[0xf]._4_4_ = 2; pSched[0xf]._4_4_ < nVars; pSched[0xf]._4_4_ = pSched[0xf]._4_4_ + 1)
  {
    piVar1 = Extra_GreyCodeSchedule(pSched[0xf]._4_4_);
    pSched[(long)pSched[0xf]._4_4_ + -1] = piVar1;
  }
  pVVar2 = Dau_DecFindSets_int(pInit,nVars,&local_a8);
  for (pSched[0xf]._4_4_ = 2; pSched[0xf]._4_4_ < nVars; pSched[0xf]._4_4_ = pSched[0xf]._4_4_ + 1)
  {
    if (pSched[(long)pSched[0xf]._4_4_ + -1] != (int *)0x0) {
      free(pSched[(long)pSched[0xf]._4_4_ + -1]);
      pSched[(long)pSched[0xf]._4_4_ + -1] = (int *)0x0;
    }
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Dau_DecFindSets( word * pInit, int nVars )
{
    Vec_Int_t * vSets;
    int v, * pSched[16] = {NULL};
    for ( v = 2; v < nVars; v++ )
        pSched[v] = Extra_GreyCodeSchedule( v );
    vSets = Dau_DecFindSets_int( pInit, nVars, pSched );
    for ( v = 2; v < nVars; v++ )
        ABC_FREE( pSched[v] );
    return vSets;
}